

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

word * capnp::_::WireHelpers::copyMessage
                 (SegmentBuilder **segment,CapTableBuilder *capTable,WirePointer **dst,
                 WirePointer *src)

{
  ushort uVar1;
  BuilderArena *pBVar2;
  WirePointer WVar3;
  Exception *pEVar4;
  CapTableBuilder *pCVar5;
  byte bVar6;
  SegmentBuilder *pSVar7;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar8;
  WirePointer WVar9;
  WirePointer *pWVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  WirePointer *pWVar14;
  SegmentBuilder **ppSVar15;
  word *result_1;
  word *__dest;
  uint uVar16;
  int iVar17;
  AllocateResult AVar18;
  SegmentBuilder *subSegment;
  WirePointer *dstRef;
  Fault local_78;
  SegmentBuilder **local_70;
  WirePointer *local_68;
  WirePointer *local_60;
  WirePointer *local_58;
  WirePointer *local_50;
  CapTableBuilder *local_48;
  uint local_40;
  uint local_3c;
  WirePointer *local_38;
  
  uVar16 = (src->offsetAndKind).value;
  iVar17 = (int)uVar16 >> 2;
  local_70 = segment;
  local_60 = src;
  local_48 = capTable;
  switch(uVar16 & 3) {
  case 0:
    if ((src->field_1).upper32Bits == 0 && uVar16 == 0) {
      pWVar10 = *dst;
      pWVar10->offsetAndKind = 0;
      pWVar10->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      return (word *)0x0;
    }
    uVar16 = (uint)(src->field_1).structRef.ptrCount.value +
             (uint)(src->field_1).structRef.dataSize.value;
    pWVar10 = *dst;
    if ((pWVar10->field_1).upper32Bits != 0 || (pWVar10->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar10);
    }
    if (uVar16 == 0) {
      local_68 = *dst;
      (local_68->offsetAndKind).value = 0xfffffffc;
      local_58 = (WirePointer *)dst;
    }
    else {
      pSVar7 = *local_70;
      local_68 = (WirePointer *)pSVar7->pos;
      if ((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)local_68)) >> 3 <
          (long)(ulong)uVar16) {
        local_68 = (WirePointer *)0x0;
      }
      else {
        pSVar7->pos = (word *)(local_68 + uVar16);
      }
      if (local_68 == (WirePointer *)0x0) {
        local_58 = (WirePointer *)dst;
        AVar18 = BuilderArena::allocate
                           ((BuilderArena *)((*local_70)->super_SegmentReader).arena,uVar16 + 1);
        local_68 = (WirePointer *)AVar18.words;
        pSVar7 = AVar18.segment;
        *local_70 = pSVar7;
        pWVar10 = *dst;
        (pWVar10->offsetAndKind).value =
             (int)AVar18.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        pWVar10->field_1 =
             (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
        *dst = local_68;
        (local_68->offsetAndKind).value = 0;
        local_68 = local_68 + 1;
      }
      else {
        ((*dst)->offsetAndKind).value =
             ((uint)((ulong)((long)local_68 - (long)*dst) >> 1) & 0xfffffffc) - 4;
        local_58 = (WirePointer *)dst;
      }
    }
    pEVar4 = (Exception *)*local_70;
    uVar1 = *(ushort *)&src->field_1;
    uVar13 = (ulong)(src->field_1).structRef.ptrCount.value;
    if (uVar1 != 0) {
      memcpy(local_68,src + (long)iVar17 + 1,(ulong)((uint)uVar1 * 8));
    }
    pCVar5 = local_48;
    if (uVar13 != 0) {
      pWVar14 = src + (long)iVar17 + 1 + uVar1;
      pWVar10 = local_68 + uVar1;
      do {
        local_78.exception = pEVar4;
        local_50 = pWVar10;
        copyMessage((SegmentBuilder **)&local_78,pCVar5,&local_50,pWVar14);
        pWVar10 = pWVar10 + 1;
        pWVar14 = pWVar14 + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    local_58 = *(WirePointer **)local_58;
    aVar8 = local_60->field_1;
    break;
  case 1:
    uVar16 = (src->field_1).upper32Bits;
    bVar6 = (byte)uVar16 & 7;
    if (bVar6 < 6) {
      uVar13 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)bVar6 * 4) * (ulong)(uVar16 >> 3) +
               0x3f >> 6;
      pWVar10 = *dst;
      if ((pWVar10->field_1).upper32Bits != 0 || (pWVar10->offsetAndKind).value != 0) {
        zeroObject(*segment,capTable,pWVar10);
      }
      ppSVar15 = local_70;
      pSVar7 = *local_70;
      __dest = pSVar7->pos;
      iVar11 = (int)uVar13;
      uVar13 = uVar13 & 0xffffffff;
      if ((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)__dest)) >> 3 < (long)uVar13) {
        __dest = (word *)0x0;
      }
      else {
        pSVar7->pos = __dest + uVar13;
      }
      if (__dest == (word *)0x0) {
        pBVar2 = (BuilderArena *)((*local_70)->super_SegmentReader).arena;
        local_58 = (WirePointer *)dst;
        if (0x1fffffff < iVar11 + 1U) {
          allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_78);
        }
        AVar18 = BuilderArena::allocate(pBVar2,iVar11 + 1U);
        WVar9 = (WirePointer)AVar18.words;
        pSVar7 = AVar18.segment;
        *ppSVar15 = pSVar7;
        WVar3 = *local_58;
        *(uint *)WVar3 =
             (int)AVar18.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        *(uint *)((long)WVar3 + 4) = (pSVar7->super_SegmentReader).id.value;
        *local_58 = WVar9;
        *(undefined4 *)WVar9 = 1;
        __dest = (word *)((long)WVar9 + 8);
        dst = (WirePointer **)local_58;
      }
      else {
        ((*dst)->offsetAndKind).value =
             ((uint)((ulong)((long)__dest - (long)*dst) >> 1) & 0xfffffffc) - 3;
      }
      if (iVar11 != 0) {
        memcpy(__dest,src + (long)iVar17 + 1,(ulong)(uint)(iVar11 << 3));
      }
      *(anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)*dst + 4) = src->field_1;
      return __dest;
    }
    if ((uVar16 & 7) != 6) {
      uVar12 = uVar16 >> 3;
      if (uVar12 == 0x1fffffff) {
        copyMessage::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_50);
      }
      pWVar10 = *dst;
      if ((pWVar10->field_1).upper32Bits != 0 || (pWVar10->offsetAndKind).value != 0) {
        zeroObject(*local_70,local_48,pWVar10);
      }
      ppSVar15 = local_70;
      pSVar7 = *local_70;
      local_68 = (WirePointer *)pSVar7->pos;
      if ((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)local_68)) >> 3 <
          (long)(ulong)(uVar12 + 1)) {
        local_68 = (WirePointer *)0x0;
      }
      else {
        pSVar7->pos = (word *)(local_68 + (uVar12 + 1));
      }
      pWVar10 = src + (long)iVar17 + 1;
      if (local_68 == (WirePointer *)0x0) {
        pBVar2 = (BuilderArena *)((*local_70)->super_SegmentReader).arena;
        if (0xffffffef < uVar16) {
          allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_78);
        }
        AVar18 = BuilderArena::allocate(pBVar2,uVar12 + 2);
        local_68 = (WirePointer *)AVar18.words;
        pSVar7 = AVar18.segment;
        *ppSVar15 = pSVar7;
        pWVar14 = *dst;
        (pWVar14->offsetAndKind).value =
             (int)AVar18.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        pWVar14->field_1 =
             (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
        *dst = local_68;
        (local_68->offsetAndKind).value = 1;
        local_68 = local_68 + 1;
      }
      else {
        ((*dst)->offsetAndKind).value =
             ((uint)((ulong)((long)local_68 - (long)*dst) >> 1) & 0xfffffffc) - 3;
      }
      ((*dst)->field_1).upper32Bits = (src->field_1).upper32Bits | 7;
      *local_68 = *pWVar10;
      uVar16 = (pWVar10->offsetAndKind).value;
      if ((uVar16 & 3) == 0) {
        local_40 = uVar16 >> 2 & 0x1fffffff;
        if (local_40 == 0) {
          return (word *)local_68;
        }
        pWVar14 = src + (long)iVar17 + 2;
        local_60 = local_68 + 1;
        local_3c = 0;
        local_38 = pWVar10;
        do {
          pEVar4 = (Exception *)*ppSVar15;
          uVar1 = *(ushort *)&local_38->field_1;
          uVar13 = (ulong)(local_38->field_1).structRef.ptrCount.value;
          if (uVar1 != 0) {
            memcpy(local_60,pWVar14,(ulong)((uint)uVar1 * 8));
          }
          pCVar5 = local_48;
          local_58 = pWVar14;
          if (uVar13 != 0) {
            pWVar14 = pWVar14 + uVar1;
            pWVar10 = local_60 + uVar1;
            do {
              local_78.exception = pEVar4;
              local_50 = pWVar10;
              copyMessage((SegmentBuilder **)&local_78,pCVar5,&local_50,pWVar14);
              pWVar10 = pWVar10 + 1;
              pWVar14 = pWVar14 + 1;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
          }
          uVar13 = (ulong)(((uint)(local_38->field_1).structRef.ptrCount.value +
                           (uint)(local_38->field_1).structRef.dataSize.value) * 8);
          pWVar14 = (WirePointer *)((long)&(local_58->offsetAndKind).value + uVar13);
          local_60 = (WirePointer *)((long)&(local_60->offsetAndKind).value + uVar13);
          local_3c = local_3c + 1;
          ppSVar15 = local_70;
        } while (local_3c != local_40);
        return (word *)local_68;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                (&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x3dd,FAILED,"srcTag->kind() == WirePointer::STRUCT",
                 "\"INLINE_COMPOSITE of lists is not yet supported.\"",
                 (char (*) [48])"INLINE_COMPOSITE of lists is not yet supported.");
      kj::_::Debug::Fault::fatal(&local_78);
    }
    uVar16 = uVar16 >> 3;
    pWVar10 = *dst;
    if ((pWVar10->field_1).upper32Bits != 0 || (pWVar10->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar10);
    }
    ppSVar15 = local_70;
    pSVar7 = *local_70;
    local_68 = (WirePointer *)pSVar7->pos;
    if ((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
              ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)local_68)) >> 3 <
        (long)(ulong)uVar16) {
      local_68 = (WirePointer *)0x0;
    }
    else {
      pSVar7->pos = (word *)(local_68 + uVar16);
    }
    if (local_68 == (WirePointer *)0x0) {
      pBVar2 = (BuilderArena *)((*local_70)->super_SegmentReader).arena;
      local_58 = (WirePointer *)dst;
      if (uVar16 == 0x1fffffff) {
        allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_78);
      }
      AVar18 = BuilderArena::allocate(pBVar2,uVar16 + 1);
      local_68 = (WirePointer *)AVar18.words;
      pSVar7 = AVar18.segment;
      *ppSVar15 = pSVar7;
      pWVar10 = *dst;
      (pWVar10->offsetAndKind).value =
           (int)AVar18.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      pWVar10->field_1 =
           (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar7->super_SegmentReader).id.value;
      *dst = local_68;
      (local_68->offsetAndKind).value = 1;
      local_68 = local_68 + 1;
    }
    else {
      ((*dst)->offsetAndKind).value =
           ((uint)((ulong)((long)local_68 - (long)*dst) >> 1) & 0xfffffffc) - 3;
      local_58 = (WirePointer *)dst;
    }
    pCVar5 = local_48;
    if (7 < (src->field_1).upper32Bits) {
      pWVar10 = src + iVar17;
      uVar13 = (ulong)((src->field_1).upper32Bits >> 3);
      pWVar14 = local_68;
      do {
        pWVar10 = pWVar10 + 1;
        local_78.exception = (Exception *)*ppSVar15;
        local_50 = pWVar14;
        copyMessage((SegmentBuilder **)&local_78,pCVar5,&local_50,pWVar10);
        pWVar14 = pWVar14 + 1;
        uVar13 = uVar13 - 1;
        ppSVar15 = local_70;
      } while (uVar13 != 0);
    }
    local_58 = *(WirePointer **)local_58;
    aVar8.upper32Bits = (local_60->field_1).upper32Bits & 0xfffffff8 | 6;
    break;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x3ee,FAILED,(char *)0x0,"\"Unchecked messages cannot contain far pointers.\"",
               (char (*) [48])"Unchecked messages cannot contain far pointers.");
    kj::_::Debug::Fault::fatal(&local_78);
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x3eb,FAILED,(char *)0x0,
               "\"Unchecked messages cannot contain OTHER pointers (e.g. capabilities).\"",
               (char (*) [70])
               "Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
    kj::_::Debug::Fault::fatal(&local_78);
  }
  (local_58->field_1).upper32Bits = (uint32_t)aVar8;
  return (word *)local_68;
}

Assistant:

static word* copyMessage(
      SegmentBuilder*& segment, CapTableBuilder* capTable,
      WirePointer*& dst, const WirePointer* src) {
    // Not always-inline because it's recursive.

    switch (src->kind()) {
      case WirePointer::STRUCT: {
        if (src->isNull()) {
          zeroMemory(dst);
          return nullptr;
        } else {
          const word* srcPtr = src->target(nullptr);
          word* dstPtr = allocate(
              dst, segment, capTable, src->structRef.wordSize(), WirePointer::STRUCT, nullptr);

          copyStruct(segment, capTable, dstPtr, srcPtr, src->structRef.dataSize.get(),
                     src->structRef.ptrCount.get());

          dst->structRef.set(src->structRef.dataSize.get(), src->structRef.ptrCount.get());
          return dstPtr;
        }
      }
      case WirePointer::LIST: {
        switch (src->listRef.elementSize()) {
          case ElementSize::VOID:
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto wordCount = roundBitsUpToWords(
                upgradeBound<uint64_t>(src->listRef.elementCount()) *
                dataBitsPerElement(src->listRef.elementSize()));
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable, wordCount, WirePointer::LIST, nullptr);
            copyMemory(dstPtr, srcPtr, wordCount);

            dst->listRef.set(src->listRef.elementSize(), src->listRef.elementCount());
            return dstPtr;
          }

          case ElementSize::POINTER: {
            const WirePointer* srcRefs = reinterpret_cast<const WirePointer*>(src->target(nullptr));
            WirePointer* dstRefs = reinterpret_cast<WirePointer*>(
                allocate(dst, segment, capTable, src->listRef.elementCount() *
                    (ONE * POINTERS / ELEMENTS) * WORDS_PER_POINTER,
                    WirePointer::LIST, nullptr));

            for (auto i: kj::zeroTo(src->listRef.elementCount() * (ONE * POINTERS / ELEMENTS))) {
              SegmentBuilder* subSegment = segment;
              WirePointer* dstRef = dstRefs + i;
              copyMessage(subSegment, capTable, dstRef, srcRefs + i);
            }

            dst->listRef.set(ElementSize::POINTER, src->listRef.elementCount());
            return reinterpret_cast<word*>(dstRefs);
          }

          case ElementSize::INLINE_COMPOSITE: {
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable,
                assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
                    src->listRef.inlineCompositeWordCount() + POINTER_SIZE_IN_WORDS,
                    []() { KJ_FAIL_ASSERT("list too big to fit in a segment"); }),
                WirePointer::LIST, nullptr);

            dst->listRef.setInlineComposite(src->listRef.inlineCompositeWordCount());

            const WirePointer* srcTag = reinterpret_cast<const WirePointer*>(srcPtr);
            copyMemory(reinterpret_cast<WirePointer*>(dstPtr), srcTag);

            const word* srcElement = srcPtr + POINTER_SIZE_IN_WORDS;
            word* dstElement = dstPtr + POINTER_SIZE_IN_WORDS;

            KJ_ASSERT(srcTag->kind() == WirePointer::STRUCT,
                "INLINE_COMPOSITE of lists is not yet supported.");

            for (auto i KJ_UNUSED: kj::zeroTo(srcTag->inlineCompositeListElementCount())) {
              copyStruct(segment, capTable, dstElement, srcElement,
                  srcTag->structRef.dataSize.get(), srcTag->structRef.ptrCount.get());
              srcElement += srcTag->structRef.wordSize();
              dstElement += srcTag->structRef.wordSize();
            }
            return dstPtr;
          }
        }
        break;
      }
      case WirePointer::OTHER:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
        break;
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain far pointers.");
        break;
    }

    return nullptr;
  }